

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

void __thiscall duckdb::CachingFileHandle::~CachingFileHandle(CachingFileHandle *this)

{
  ::std::__cxx11::string::~string((string *)&this->version_tag);
  ::std::unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>::~unique_ptr
            (&(this->file_handle).
              super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>);
  OpenFileInfo::~OpenFileInfo(&this->path);
  return;
}

Assistant:

CachingFileHandle::~CachingFileHandle() {
}